

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O1

sample_type __thiscall
charls::jls_codec<charls::lossless_traits<unsigned_short,_16>,_charls::encoder_strategy>::
encode_run_interruption_pixel
          (jls_codec<charls::lossless_traits<unsigned_short,_16>,_charls::encoder_strategy> *this,
          int32_t x,int32_t ra,int32_t rb)

{
  short sVar1;
  sample_type sVar2;
  short sVar3;
  
  sVar2 = (sample_type)x;
  if (ra == rb) {
    encode_run_interruption_error
              (this,(this->context_run_mode_)._M_elems + 1,(int)(short)(sVar2 - (short)ra));
  }
  else {
    sVar3 = (ushort)(ra <= rb) * 2 + -1;
    sVar1 = (sVar2 - (short)rb) * sVar3;
    encode_run_interruption_error(this,(this->context_run_mode_)._M_elems,(int)sVar1);
    sVar2 = sVar1 * sVar3 + (short)rb;
  }
  return sVar2;
}

Assistant:

sample_type encode_run_interruption_pixel(const int32_t x, const int32_t ra, const int32_t rb)
    {
        if (std::abs(ra - rb) <= traits_.near_lossless)
        {
            const int32_t error_value{traits_.compute_error_value(x - ra)};
            encode_run_interruption_error(context_run_mode_[1], error_value);
            return static_cast<sample_type>(traits_.compute_reconstructed_sample(ra, error_value));
        }

        const int32_t error_value{traits_.compute_error_value((x - rb) * sign(rb - ra))};
        encode_run_interruption_error(context_run_mode_[0], error_value);
        return static_cast<sample_type>(traits_.compute_reconstructed_sample(rb, error_value * sign(rb - ra)));
    }